

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoll.c
# Opt level: O0

int ffpcll(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,char *array
          ,int *status)

{
  int iVar1;
  long lVar2;
  long in_R8;
  long in_R9;
  fitsfile *in_stack_00000008;
  char snull [20];
  char message [81];
  char cfalse;
  char ctrue;
  char tform [20];
  double zero;
  double scale;
  LONGLONG tnull;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG wrtptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  long incre;
  long twidth;
  int hdutype;
  int maxelem;
  int tcode;
  int *status_00;
  undefined1 *puVar3;
  undefined1 *bytepos;
  fitsfile *fptr_00;
  int *status_01;
  undefined1 *buffer;
  undefined1 *nbytes;
  fitsfile *fptr_01;
  undefined1 local_178 [28];
  int in_stack_fffffffffffffea4;
  LONGLONG in_stack_fffffffffffffea8;
  LONGLONG in_stack_fffffffffffffeb0;
  LONGLONG in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  fitsfile *in_stack_fffffffffffffec8;
  double *in_stack_fffffffffffffee0;
  double *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  long *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  LONGLONG *in_stack_ffffffffffffff10;
  LONGLONG *in_stack_ffffffffffffff18;
  long *in_stack_ffffffffffffff20;
  LONGLONG *in_stack_ffffffffffffff28;
  LONGLONG *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  long lVar4;
  LONGLONG *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  long local_a0;
  long local_90;
  undefined1 local_80 [12];
  int local_74 [2];
  undefined1 local_6c [56];
  int local_34;
  
  if (in_stack_00000008->HDUposition < 1) {
    puVar3 = &stack0xffffffffffffff08;
    nbytes = local_178;
    status_00 = (int *)&stack0xffffffffffffff20;
    bytepos = local_80;
    fptr_00 = (fitsfile *)local_6c;
    status_01 = local_74;
    buffer = &stack0xffffffffffffff30;
    fptr_01 = in_stack_00000008;
    local_6c._4_8_ = in_R9;
    local_6c._12_8_ = in_R8;
    iVar1 = ffgcprll(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                     in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,
                     in_stack_fffffffffffffef8,
                     (int *)CONCAT17(0x54,CONCAT16(0x46,in_stack_ffffffffffffff00)),
                     in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff50);
    if (iVar1 < 1) {
      if (local_6c._0_4_ == 0xe) {
        lVar4 = 0;
        lVar2 = local_6c._12_8_;
        while (lVar2 != 0) {
          ffmbyt(fptr_00,(LONGLONG)bytepos,(int)((ulong)puVar3 >> 0x20),status_00);
          if (*(char *)(local_6c._4_8_ + lVar4) == '\0') {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_01);
          }
          else {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_01);
          }
          if (0 < in_stack_00000008->HDUposition) {
            snprintf(&stack0xfffffffffffffea8,0x51,
                     "Error writing element %.0f of input array of logicals (ffpcll).",
                     (double)(lVar4 + 1));
            ffpmsg((char *)0x21e0e5);
            return in_stack_00000008->HDUposition;
          }
          lVar2 = lVar2 + -1;
          if (lVar2 != 0) {
            lVar4 = lVar4 + 1;
            local_a0 = local_a0 + 1;
            if (local_a0 == local_90) {
              local_a0 = 0;
            }
          }
        }
        local_34 = in_stack_00000008->HDUposition;
      }
      else {
        in_stack_00000008->HDUposition = 0x136;
        local_34 = 0x136;
      }
    }
    else {
      local_34 = in_stack_00000008->HDUposition;
    }
  }
  else {
    local_34 = in_stack_00000008->HDUposition;
  }
  return local_34;
}

Assistant:

int ffpcll( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            char *array,     /* I - array of values to write                */
            int  *status)    /* IO - error status                           */
/*
  Write an array of logical values to a column in the current FITS HDU.
*/
{
    int tcode, maxelem, hdutype;
    long twidth, incre;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, tnull;
    double scale, zero;
    char tform[20], ctrue = 'T', cfalse = 'F';
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 1, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode != TLOGICAL)   
        return(*status = NOT_LOGICAL_COL);

    /*---------------------------------------------------------------------*/
    /*  Now write the logical values one at a time to the FITS column.     */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
      wrtptr = startpos + (rowlen * rownum) + (elemnum * incre);

      ffmbyt(fptr, wrtptr, IGNORE_EOF, status);  /* move to write position */

      if (array[next])
         ffpbyt(fptr, 1, &ctrue, status);
      else
         ffpbyt(fptr, 1, &cfalse, status);

      if (*status > 0)  /* test for error during previous write operation */
      {
        snprintf(message,FLEN_ERRMSG,
           "Error writing element %.0f of input array of logicals (ffpcll).",
            (double) (next+1));
        ffpmsg(message);
        return(*status);
      }

      /*--------------------------------------------*/
      /*  increment the counters for the next loop  */
      /*--------------------------------------------*/
      remain--;
      if (remain)
      {
        next++;
        elemnum++;
        if (elemnum == repeat)  /* completed a row; start on next row */
        {
           elemnum = 0;
           rownum++;
        }
      }

    }  /*  End of main while Loop  */

    return(*status);
}